

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

value_type __thiscall djb::merl::eval(merl *this,vec3 *wi,vec3 *wo,void *param_3)

{
  float fVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  int iVar6;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar7;
  ulong uVar8;
  int iVar9;
  float fVar10;
  value_type vVar11;
  float_t th;
  float_t pd;
  float_t td;
  float_t ph;
  float local_88;
  float local_84;
  float local_80;
  float_t local_7c;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  vec3 local_50;
  vec3 local_40;
  
  if ((0.0 < wo->z) && (0.0 < *(float *)((long)param_3 + 8))) {
    local_40.x = 0.0;
    local_40.y = 0.0;
    iVar9 = 0;
    local_40.z = 0.0;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    brdf::io_to_hd(wo,(vec3 *)param_3,&local_40,&local_50);
    xyz_to_theta_phi(&local_40,&local_88,&local_7c);
    xyz_to_theta_phi(&local_50,&local_80,&local_84);
    iVar3 = (int)(((float)(~-(uint)(local_84 < 0.0) & (uint)local_84 |
                          (uint)(local_84 + 3.1415927) & -(uint)(local_84 < 0.0)) / 3.1415927) *
                  360.0 * 0.5);
    iVar6 = 0xb3;
    if (iVar3 < 0xb3) {
      iVar6 = iVar3;
    }
    if (iVar6 < 1) {
      iVar6 = iVar9;
    }
    iVar4 = (int)((local_80 / 1.5707964) * 90.0);
    iVar3 = 0x59;
    if (iVar4 < 0x59) {
      iVar3 = iVar4;
    }
    if (iVar3 < 1) {
      iVar3 = iVar9;
    }
    if (0.0 < local_88) {
      fVar10 = (local_88 / 1.5707964) * 90.0 * 90.0;
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      iVar4 = 0x59;
      if ((int)fVar10 < 0x59) {
        iVar4 = (int)fVar10;
      }
      iVar9 = 0;
      if (0 < iVar4) {
        iVar9 = iVar4;
      }
      iVar9 = iVar9 * 0x3f48;
    }
    uVar8 = (ulong)(uint)(iVar3 * 0xb4 + iVar6 + iVar9);
    lVar2 = *(long *)&wi->z;
    local_78 = (float)(*(double *)(lVar2 + uVar8 * 8) * 0.0006666666666666666);
    fStack_74 = (float)(*(double *)(lVar2 + 0xb1fa80 + uVar8 * 8) * 0.0007666666666666666);
    if (((0.0 <= local_78) && (0.0 <= fStack_74)) &&
       (fVar10 = (float)(*(double *)(lVar2 + 0x163f500 + uVar8 * 8) * 0.0011066666666666666),
       0.0 <= fVar10)) {
      fVar1 = *(float *)((long)param_3 + 8);
      local_68 = ZEXT416((uint)fVar1);
      (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)0x3;
      uStack_70 = 0;
      pdVar5 = (pointer)operator_new(0xc);
      (this->m_samples).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = pdVar5;
      *pdVar5 = (double)CONCAT44((float)local_68._0_4_ * fStack_74,(float)local_68._0_4_ * local_78)
      ;
      *(float *)(pdVar5 + 1) = fVar10 * fVar1;
      pfVar7 = extraout_RDX;
      goto LAB_0014404d;
    }
    fwrite("djb_verbose: below horizon\n",0x1b,1,_stdout);
  }
  (**(code **)(*(long *)wi + 0x10))(this,wi);
  pfVar7 = extraout_RDX_00;
LAB_0014404d:
  vVar11._M_data = pfVar7;
  vVar11._M_size = (size_t)this;
  return vVar11;
}

Assistant:

brdf::value_type merl::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	if (wi.z > 0 && wo.z > 0) {
		// convert to half / diff angle coordinates
		vec3 wh, wd;
		float_t th, ph, td, pd;
		io_to_hd(wi, wo, &wh, &wd);
		xyz_to_theta_phi(wh, &th, &ph);
		xyz_to_theta_phi(wd, &td, &pd);

		// compute indexes
		int idx_r = phi_diff_index(pd)
		          + theta_diff_index(td)
		          * MERL_SAMPLING_RES_PHI_D / 2
		          + theta_half_index(th)
		          * MERL_SAMPLING_RES_PHI_D / 2
		          * MERL_SAMPLING_RES_THETA_D;
		int idx_g = idx_r + MERL_SAMPLING_RES_THETA_H
		          * MERL_SAMPLING_RES_THETA_D
		          * MERL_SAMPLING_RES_PHI_D / 2;
		int idx_b = idx_r + MERL_SAMPLING_RES_THETA_H
		          * MERL_SAMPLING_RES_THETA_D
		          * MERL_SAMPLING_RES_PHI_D;

		// get color
		vec3 rgb;
		rgb.x = m_samples[idx_r] * MERL_RED_SCALE;
		rgb.y = m_samples[idx_g] * MERL_GREEN_SCALE;
		rgb.z = m_samples[idx_b] * MERL_BLUE_SCALE;

		if (rgb.x < 0 || rgb.y < 0 || rgb.z < 0) {
#ifndef NVERBOSE
			DJB_LOG("djb_verbose: below horizon\n");
#endif
			return zero_value();
		}
		rgb*= wo.z;

		return brdf::value_type(&rgb[0], 3);
	}

	return zero_value();
}